

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::Server::stop(Server *this)

{
  socket_t sock;
  
  if (((this->is_running_)._M_base._M_i & 1U) == 0) {
    return;
  }
  if ((this->svr_sock_).super___atomic_base<int>._M_i != -1) {
    LOCK();
    sock = (this->svr_sock_).super___atomic_base<int>._M_i;
    (this->svr_sock_).super___atomic_base<int>._M_i = -1;
    UNLOCK();
    detail::shutdown_socket(sock);
    close(sock);
    return;
  }
  __assert_fail("svr_sock_ != INVALID_SOCKET",
                "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h"
                ,0x135d,"void httplib::Server::stop()");
}

Assistant:

Response(const Response &) = default;